

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_functype_t * wasm_functype_new(wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  ExternType *pEVar1;
  _func_int **pp_Var2;
  FILE *pFVar3;
  bool bVar4;
  wasm_functype_t *this;
  char *pcVar5;
  _func_int **pp_Var6;
  Type local_48;
  Type Type;
  
  fprintf(_stderr,"CAPI: [%s] params=%zx args=%zx\n","wasm_functype_new",params->size,results->size)
  ;
  this = (wasm_functype_t *)operator_new(0x30);
  wasm_functype_t::wasm_functype_t(this,params,results);
  fprintf(_stderr,"CAPI: [%s] ","wasm_functype_new");
  pEVar1 = (this->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  if (pEVar1->kind == First) {
    fputc(0x28,_stderr);
    pp_Var6 = pEVar1[1]._vptr_ExternType;
    pp_Var2 = *(_func_int ***)&pEVar1[1].kind;
    if (pp_Var6 != pp_Var2) {
      bVar4 = true;
      do {
        Type.enum_ = *(Enum *)pp_Var6;
        if (!bVar4) {
          fwrite(", ",2,1,_stderr);
        }
        pFVar3 = _stderr;
        pcVar5 = wabt::Type::GetName(&Type);
        fputs(pcVar5,pFVar3);
        pp_Var6 = (_func_int **)((long)pp_Var6 + 4);
        bVar4 = false;
      } while (pp_Var6 != pp_Var2);
    }
    fwrite(") -> (",6,1,_stderr);
    pp_Var6 = *(_func_int ***)&pEVar1[2].kind;
    pp_Var2 = pEVar1[3]._vptr_ExternType;
    if (pp_Var6 != pp_Var2) {
      bVar4 = true;
      do {
        local_48.enum_ = *(Enum *)pp_Var6;
        if (!bVar4) {
          fwrite(", ",2,1,_stderr);
        }
        pFVar3 = _stderr;
        pcVar5 = wabt::Type::GetName(&local_48);
        fputs(pcVar5,pFVar3);
        pp_Var6 = (_func_int **)((long)pp_Var6 + 4);
        bVar4 = false;
      } while (pp_Var6 != pp_Var2);
    }
    fwrite(")\n",2,1,_stderr);
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
               );
}

Assistant:

own wasm_functype_t* wasm_functype_new(own wasm_valtype_vec_t* params,
                                       own wasm_valtype_vec_t* results) {
  TRACE("params=%" PRIzx " args=%" PRIzx, params->size, results->size);
  auto* res = new wasm_functype_t{params, results};
  TRACE_NO_NL("");
  print_sig(*res->As<FuncType>());
  return res;
}